

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cc
# Opt level: O1

void __thiscall
sentencepiece::filesystem::PosixWritableFile::PosixWritableFile
          (PosixWritableFile *this,string_view filename,bool is_binary)

{
  ostringstream *this_00;
  ostream *this_01;
  StatusBuilder *pSVar1;
  uint *puVar2;
  int errnum;
  undefined1 auStack_1d8 [8];
  string local_1d0;
  char *local_1b0;
  undefined1 local_1a8 [384];
  
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)&PTR__PosixWritableFile_003824f0;
  util::Status::Status(&this->status_);
  if (filename._M_len == 0) {
    this_01 = (ostream *)&std::cout;
  }
  else {
    this_01 = (ostream *)operator_new(0x200);
    std::ofstream::ofstream(this_01,filename._M_str,(uint)is_binary * 4 + _S_out);
  }
  this->os_ = this_01;
  if (((byte)this_01[*(long *)(*(long *)this_01 + -0x18) + 0x20] & 5) != 0) {
    this_00 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_4_ = kPermissionDenied;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\"",1);
    local_1b0 = filename._M_str;
    pSVar1 = util::StatusBuilder::operator<<((StatusBuilder *)local_1a8,&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSVar1->os_,"\": ",3);
    puVar2 = (uint *)__errno_location();
    util::StrError_abi_cxx11_(&local_1d0,(util *)(ulong)*puVar2,errnum);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pSVar1->os_,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)auStack_1d8);
    util::Status::operator=(&this->status_,(Status *)auStack_1d8);
    util::Status::~Status((Status *)auStack_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
  }
  return;
}

Assistant:

PosixWritableFile(absl::string_view filename, bool is_binary = false)
      : os_(filename.empty()
                ? &std::cout
                : new std::ofstream(WPATH(filename),
                                    is_binary ? std::ios::binary | std::ios::out
                                              : std::ios::out)) {
    if (!*os_)
      status_ =
          util::StatusBuilder(util::StatusCode::kPermissionDenied, GTL_LOC)
          << "\"" << filename.data() << "\": " << util::StrError(errno);
  }